

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O0

int CVmSaveFile::restore_get_image(osfildef *fp,char *fname_buf,size_t fname_buf_len)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong in_RDX;
  void *in_RSI;
  FILE *in_RDI;
  size_t len;
  char buf [128];
  undefined1 local_a8 [136];
  ulong local_20;
  void *local_18;
  FILE *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar2 = fread(local_a8,0x31,1,in_RDI);
  if (sVar2 == 1) {
    iVar1 = memcmp(local_a8,"T3-state-v000A\r\n\x1a",0x11);
    if (iVar1 == 0) {
      sVar2 = fread(local_a8,2,1,local_10);
      if (sVar2 == 1) {
        iVar1 = ::osrp2(local_a8);
        sVar2 = (size_t)iVar1;
        if (local_20 < sVar2 + 1) {
          local_4 = 0x65;
        }
        else {
          sVar3 = fread(local_18,sVar2,1,local_10);
          if (sVar3 == 1) {
            *(undefined1 *)((long)local_18 + sVar2) = 0;
            local_4 = 0;
          }
          else {
            local_4 = 0x65;
          }
        }
      }
      else {
        local_4 = 0x65;
      }
    }
    else {
      local_4 = 0x4b1;
    }
  }
  else {
    local_4 = 0x65;
  }
  return local_4;
}

Assistant:

int CVmSaveFile::restore_get_image(osfildef *fp,
                                   char *fname_buf, size_t fname_buf_len)
{
    /* read the signature, size/checksum, and timestamp fields */
    char buf[128];
    if (osfrb(fp, buf, sizeof(VMSAVEFILE_SIG)-1 + 8 + 24))
        return VMERR_READ_FILE;

    /* check the signature */
    if (memcmp(buf, VMSAVEFILE_SIG, sizeof(VMSAVEFILE_SIG)-1) != 0)
        return VMERR_NOT_SAVED_STATE;

    /* read the length of the image file name */
    if (osfrb(fp, buf, 2))
        return VMERR_READ_FILE;

    /* get the length from the buffer */
    size_t len = osrp2(buf);

    /* if it won't fit in the buffer, return an error */
    if (len + 1 > fname_buf_len)
        return VMERR_READ_FILE;

    /* read the name into the caller's buffer */
    if (osfrb(fp, fname_buf, len))
        return VMERR_READ_FILE;

    /* null-terminate the name */
    fname_buf[len] = '\0';

    /* success */
    return 0;
}